

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool ReplaceDefineInternal(char *lp,char *nl)

{
  int iVar1;
  byte *pbVar2;
  ulong *name;
  ulong *__s;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  CStringsList *pCVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  byte bVar14;
  bool bVar15;
  char *rp;
  char *kp;
  char defarrayCountTxt [16];
  byte *local_80;
  byte local_72;
  undefined1 local_71;
  byte *local_70;
  int local_64;
  byte *local_60;
  uint local_58;
  uint local_54;
  byte *local_50;
  ulong local_48 [3];
  
  local_48[0] = 0;
  local_48[1] = 0;
  bVar13 = *lp;
  local_70 = (byte *)nl;
  local_80 = (byte *)lp;
  if (bVar13 == 0) {
    local_64 = 0;
LAB_001211cf:
    *local_70 = 0;
    if (0x7ff < (long)(local_70 + 1) - (long)nl) {
      local_70 = local_70 + 1;
      Error("line too long after macro expansion",nl,SUPPRESS);
    }
    local_70 = (byte *)nl;
    iVar1 = SkipBlanks((char **)&local_70);
    if (iVar1 != 0) {
      *nl = 0;
    }
    substitutedLine = nl;
    return local_64 != 0;
  }
  local_48[2] = 1 - (long)nl;
  local_64 = 0;
  local_58 = 0;
  bVar7 = 1;
  local_60 = (byte *)nl;
  do {
    pbVar2 = local_70;
    pbVar5 = local_80;
    bVar8 = local_80[1];
    iVar1 = isalnum((uint)bVar13);
    nl = (char *)local_60;
    bVar14 = iVar1 == 0;
    if (bVar8 == 0x2a && (bVar13 ^ 0x2f) == 0) {
      comlin = comlin + 1;
      local_80 = pbVar5 + 2;
    }
    else {
      pbVar4 = pbVar5 + 1;
      bVar8 = bVar8 ^ 0x2f;
      if (comlin == 0) {
        if ((bVar13 == 0x3b) || ((bVar13 ^ 0x2f) == 0 && bVar8 == 0)) {
          local_70 = pbVar2;
          if ((pbVar5 < temp && (byte *)0x18ea1f < pbVar5) && eolComment == (char *)0x0) {
            eolComment = (char *)pbVar5;
          }
          goto LAB_001211cf;
        }
        if ((bVar7 & 1) == 0) {
          local_72 = bVar14;
          bVar15 = isLabelStart((char *)pbVar5,false);
          if (bVar15) {
            local_50 = local_80;
            uVar12 = 0;
            goto LAB_00120d9c;
          }
LAB_0012119d:
          local_70 = pbVar2 + 1;
          *pbVar2 = *local_80;
          bVar14 = local_72;
          local_80 = local_80 + 1;
        }
        else if ((bVar13 == 0x27) || (bVar13 == 0x22)) {
          local_70 = pbVar2 + 1;
          *pbVar2 = *pbVar5;
          bVar7 = *pbVar4;
          bVar15 = bVar7 == 0;
          local_80 = pbVar4;
          if (bVar13 != bVar7 && !bVar15) {
            do {
              pbVar2 = local_70;
              pbVar5 = pbVar4;
              if ((bVar7 == 0x5c && bVar13 == 0x22) && (pbVar4[1] != 0)) {
                pbVar5 = pbVar4 + 1;
                pbVar2 = local_70 + 1;
                *local_70 = *pbVar4;
              }
              pbVar4 = pbVar5 + 1;
              local_70 = pbVar2 + 1;
              *pbVar2 = *pbVar5;
              bVar7 = *pbVar4;
              bVar15 = bVar7 == 0;
              local_80 = pbVar4;
            } while ((!bVar15) && (bVar13 != bVar7));
          }
          if (!bVar15) {
            *local_70 = *local_80;
            local_80 = local_80 + 1;
            local_70 = local_70 + 1;
          }
        }
        else {
          local_72 = bVar14;
          bVar15 = isLabelStart((char *)pbVar5,false);
          if (!bVar15) goto LAB_0012119d;
          local_50 = local_80;
          iVar1 = cmphstr((char **)&local_50,"define+",false);
          uVar12 = 1;
          uVar11 = 1;
          if ((((iVar1 == 0) &&
               (iVar1 = cmphstr((char **)&local_50,"define",false), uVar12 = uVar11, iVar1 == 0)) &&
              (iVar1 = cmphstr((char **)&local_50,"undefine",false), iVar1 == 0)) &&
             (((iVar1 = cmphstr((char **)&local_50,"defarray+",false), iVar1 == 0 &&
               (iVar1 = cmphstr((char **)&local_50,"defarray",false), iVar1 == 0)) &&
              (iVar1 = cmphstr((char **)&local_50,"ifdef",false), iVar1 == 0)))) {
            iVar1 = cmphstr((char **)&local_50,"ifndef",false);
            uVar12 = (uint)(iVar1 != 0);
          }
LAB_00120d9c:
          local_58 = (byte)local_58 & 1 | uVar12;
          ResetGrowSubId();
          pbVar5 = local_80;
          pbVar2 = local_80;
          do {
            name = (ulong *)GrowSubId((char **)&local_80);
            bVar15 = (char)*name == '_';
            if (((macrolabp == (char *)0x0) || (pbVar2 != pbVar5 && bVar15)) ||
               (__s = (ulong *)CMacroDefineTable::getverv(&MacroDefineTable,(char *)name),
               __s == (ulong *)0x0)) {
              if (((pbVar2 == pbVar5 || !bVar15) && (local_58 & 1) == 0) &&
                 (__s = (ulong *)CDefineTable::Get(&DefineTable,(char *)name),
                 pCVar10 = DefineTable.DefArrayList, __s != (ulong *)0x0)) {
                if (DefineTable.DefArrayList == (CStringsList *)0x0) {
LAB_00120f1e:
                  local_64 = 1;
                }
                else {
                  bVar15 = White(*local_80);
                  if (bVar15) {
                    do {
                      GrowSubIdByExtraChar((char **)&local_80);
                      bVar15 = White(*local_80);
                    } while (bVar15);
                  }
                  if ((*local_80 == 0x5b) ||
                     (Error("[ARRAY] Expression error",(char *)pbVar2,SUPPRESS), *local_80 == 0x5b))
                  {
                    lVar9 = 1;
                    if ((local_80[1] == 0x23) && (local_80[2] == 0x5d)) {
                      local_80 = local_80 + 3;
                      uVar6 = 0;
                      do {
                        uVar6 = (ulong)((int)uVar6 + 1);
                        pCVar10 = pCVar10->next;
                      } while (pCVar10 != (CStringsList *)0x0);
                      __s = local_48;
                      snprintf((char *)__s,0x10,"%d",uVar6);
                      nl = (char *)local_60;
                      goto LAB_00120f1e;
                    }
                  }
                  else {
                    lVar9 = 0;
                  }
                  pbVar4 = local_80;
                  IsLabelNotFound = false;
                  if ((*local_80 == 0x5b) &&
                     (pcVar3 = GrowSubIdByExtraChar((char **)&local_80), pcVar3 != (char *)0x0)) {
                    if (IsSubstituting == true) {
                      __assert_fail("!IsSubstituting",
                                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/parser.cpp"
                                    ,0x18d,"int ParseExpressionInSubstitution(char *&, aint &)");
                    }
                    IsSubstituting = true;
                    local_71 = synerr;
                    synerr = 1;
                    iVar1 = ParseExpression((char **)&local_80,(aint *)&local_54);
                    nl = (char *)local_60;
                    synerr = local_71;
                    IsSubstituting = false;
                    if (((iVar1 != 0) && (*local_80 == 0x5d)) && (IsLabelNotFound == false)) {
                      local_80 = local_80 + 1;
                      uVar12 = local_54;
                      if (0 < (int)local_54) {
                        do {
                          pCVar10 = pCVar10->next;
                          local_54 = uVar12 - 1;
                          if (uVar12 < 2) break;
                          uVar12 = local_54;
                        } while (pCVar10 != (CStringsList *)0x0);
                      }
                      if (pCVar10 == (CStringsList *)0x0 || (int)local_54 < 0) {
                        local_48[0] = local_48[0] & 0xffffffffffffff00;
                        Error("[ARRAY] index not in 0..<Size-1> range",(char *)pbVar2,SUPPRESS);
                        __s = local_48;
                      }
                      else {
                        __s = (ulong *)pCVar10->string;
                      }
                      goto LAB_00120f1e;
                    }
                  }
                  local_80 = pbVar4 + lVar9;
                  nl = (char *)local_60;
                  __s = name;
                }
                goto LAB_00120fc4;
              }
              iVar1 = islabchar(*local_80);
              if (iVar1 == 0) {
                local_80 = pbVar2;
                ResetGrowSubId();
                __s = (ulong *)GrowSubId((char **)&local_80);
                goto LAB_00120fc4;
              }
            }
            else {
              local_64 = 1;
LAB_00120fc4:
              bVar13 = (byte)*__s;
              if ((long)local_70 - (long)nl < 0x800 && bVar13 != 0) {
                pbVar4 = local_70 + local_48[2];
                pbVar2 = local_70;
                do {
                  __s = (ulong *)((long)__s + 1);
                  local_70 = pbVar2 + 1;
                  *pbVar2 = bVar13;
                  bVar13 = *(byte *)__s;
                  if (bVar13 == 0) break;
                  bVar15 = (long)pbVar4 < 0x800;
                  pbVar4 = pbVar4 + 1;
                  pbVar2 = local_70;
                } while (bVar15);
              }
              ResetGrowSubId();
              pbVar2 = local_80;
            }
            iVar1 = islabchar(*local_80);
            bVar14 = local_72;
          } while (iVar1 != 0);
        }
      }
      else {
        local_80 = pbVar4;
        if (bVar13 == 0x2a && bVar8 == 0) {
          if (comlin == 1) {
            local_70 = pbVar2 + 1;
            *pbVar2 = 0x20;
          }
          comlin = comlin + -1;
          local_80 = pbVar5 + 2;
        }
      }
    }
    bVar13 = *local_80;
    if ((bVar13 == 0) || (bVar7 = bVar14, 0x7ff < (long)local_70 - (long)nl)) goto LAB_001211cf;
  } while( true );
}

Assistant:

static bool ReplaceDefineInternal(char* lp, char* const nl) {
	int definegereplaced = 0,dr;
	char* rp = nl,* nid;
	const char* ver;
	bool isDefDir = false;	// to remember if one of DEFINE-related directives was used
	bool afterNonAlphaNum, afterNonAlphaNumNext = true;
	char defarrayCountTxt[16] = { 0 };
	while (*lp && ((rp - nl) < LINEMAX)) {
		const char c1 = lp[0], c2 = lp[1];
		afterNonAlphaNum = afterNonAlphaNumNext;
		afterNonAlphaNumNext = !isalnum((byte)c1);
		if (c1 == '/' && c2 == '*') {	// block-comment local beginning (++block_nesting)
			lp += 2;
			++comlin;
			continue;
		}
		if (comlin) {
			if (c1 == '*' && c2 == '/') {
				lp += 2;
				// insert space into line, if the block ending may have affected parsing of line
				if (1 == comlin) {
					*rp++ = ' ';		// ^^ otherwise this line is completely commented out
				}
				--comlin;	// decrement block comment counter
			} else {
				++lp;		// just skip all characters inside comment block
			}
			continue;
		}
		// for following code (0 == comlin) (unless it has its own parse loop)

		// single line comments -> finish
		if (c1 == ';' || (c1 == '/' && c2 == '/')) {
			// set empty eol line comment, if the source of data is still the original "line" buffer
			if (!eolComment && line <= lp && lp < line+LINEMAX) eolComment = lp;
			break;
		}

		// strings parsing
		if (afterNonAlphaNum && (c1 == '"' || c1 == '\'')) {
			*rp++ = *lp++;				// copy the string delimiter (" or ')
			// apostrophe inside apostrophes ('') will parse as end + start of another string
			// which sort of "accidentally" leads to correct final results
			while (*lp && c1 != *lp) {	// until end of current string is reached (or line ends)
				// inside double quotes the backslash should escape (anything after it)
				if ('"' == c1 && '\\' == *lp && lp[1]) *rp++ = *lp++;	// copy escaping backslash extra
				*rp++ = *lp++;			// copy string character
			}
			if (*lp) *rp++ = *lp++;		// copy the ending string delimiter (" or ')
			continue;
		}

		if (!isLabelStart(lp, false)) {
			*rp++ = *lp++;
			continue;
		}

		// update "is define-related directive" for remainder of the line
		char* kp = lp;
		isDefDir |= afterNonAlphaNum && (cmphstr(kp, "define+") || cmphstr(kp, "define")
			|| cmphstr(kp, "undefine") || cmphstr(kp, "defarray+") || cmphstr(kp, "defarray")
			|| cmphstr(kp, "ifdef") || cmphstr(kp, "ifndef"));
		// if DEFINE-related directive was used, only macro-arguments are substituted
		// in the remaining part of the line, the define-based substitution is inhibited till EOL

		// The following loop is recursive-like macro/define substitution, the `*lp` here points
		// at alphabet/underscore char, marking start of "id" string, and it will be parsed by
		// sub-id parts, delimited by underscores, each combination of consecutive sub-ids may
		// be substituted by some macro argument or define.

		//TODO - maybe consider the substitution search to go downward, from longest term to shortest subterm
		ResetGrowSubId();
		char* nextSubIdLp = lp, * wholeIdLp = lp;
		do { //while(islabchar(*lp));
			nid = GrowSubId(lp);		// grow the current sub-id part by part, checking each combination for substitution
			// defines/macro arguments can substitute in the middle of ID only if they don't start with underscore
			const bool canSubstituteInside = '_' != nid[0] || nextSubIdLp == wholeIdLp;
			if (macrolabp && canSubstituteInside && (ver = MacroDefineTable.getverv(nid))) {
				dr = 2;			// macro argument substitution is possible
			} else if (!isDefDir && canSubstituteInside && (ver = DefineTable.Get(nid))) {
				dr = 1;			// DEFINE substitution is possible
				//handle DEFARRAY case
				if (DefineTable.DefArrayList) {
					ver = nid;	// in case of some error, just copy the array id "as is"
					CStringsList* a = DefineTable.DefArrayList;
					while (White(*lp)) GrowSubIdByExtraChar(lp);
					aint val;
					if ('[' != *lp) Error("[ARRAY] Expression error", nextSubIdLp, SUPPRESS);
					if ('[' == *lp && '#' == lp[1] && ']' == lp[2]) {	// calculate size of defarray
						lp += 3;
						val = 0;
						while (a) {
							++val;
							a = a->next;
						}
						SPRINTF1(defarrayCountTxt, 16, "%d", val);
						ver = defarrayCountTxt;
					} else {
						char* expLp = lp + ('[' == *lp);	// the '[' will become part of subId in didParseBrackets
						IsLabelNotFound = false;
						bool didParseBrackets = '[' == *lp && GrowSubIdByExtraChar(lp) && ParseExpressionInSubstitution(lp, val) && ']' == *lp;
						if (didParseBrackets && !IsLabelNotFound) {
							// expression was successfully parsed and all values were known
							++lp;
							while (0 < val && a) {
								a = a->next;
								--val;
							}
							if (val < 0 || NULL == a) {
								*defarrayCountTxt = 0;		// substitute with empty string
								ver = defarrayCountTxt;
								Error("[ARRAY] index not in 0..<Size-1> range", nextSubIdLp, SUPPRESS);
							} else {
								ver = a->string;	// substitute with array value
							}
						} else {	// no substition of array possible at this time (index eval / syntax error)
							lp = expLp;				// restore lp in case expression parser went ahead a lot
							dr = -1;// write into output, but don't count as replacement
						}
					}
				}
			} else {
				dr = 0;			// no possible substitution found
				ver = nid;
			}
			// check if no substition was found, and there's no more chars to extend SubId
			if (0 == dr && !islabchar(*lp)) {
				lp = nextSubIdLp;		// was fully extended, no match, "eat" first subId
				ResetGrowSubId();
				ver = GrowSubId(lp);	// find the first SubId again, for the copy
				dr = -1;				// write into output, but don't count as replacement
			}
			if (0 < dr) definegereplaced = 1;		// above zero => count as replacement
			if (0 != dr) {				// any non-zero dr => write to the output
				while (*ver && ((rp - nl) < LINEMAX)) *rp++ = *ver++;		// replace the string into target buffer
				// reset subId parser to catch second+ subId in current Id
				ResetGrowSubId();
				nextSubIdLp = lp;
			}
			// continue with extending the subId, if there's still something to parse
		} while(islabchar(*lp));
	} // while(*lp)
	// add line terminator to the output buffer
	*rp++ = 0;
	if (LINEMAX <= (rp - nl)) {
		Error("line too long after macro expansion", nl, SUPPRESS);
	}
	// check if whole line is just blanks, then return just empty one
	rp = nl;
	if (SkipBlanks(rp)) *nl = 0;
	substitutedLine = nl;		// set global pointer to the latest substituted version
	return definegereplaced;
}